

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_bx32(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int reg;
  uint uVar1;
  DisasJumpType DVar2;
  TCGv_i64 ret;
  int local_54;
  TCGv_i64 t;
  DisasCompare_conflict2 c;
  int imm;
  _Bool is_imm;
  int r3;
  int r1;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  reg = get_field1(s,FLD_O_r1,FLD_C_b1);
  uVar1 = get_field1(s,FLD_O_r3,FLD_C_i3);
  c.u._15_1_ = have_field1(s,FLD_O_i2);
  if ((bool)c.u._15_1_) {
    local_54 = get_field1(s,FLD_O_i2,FLD_C_b2);
  }
  else {
    local_54 = 0;
  }
  c.u._8_4_ = local_54;
  t._0_1_ = 0xb;
  if (s->insn->data != 0) {
    t._0_1_ = 10;
  }
  t._1_1_ = 0;
  t._2_1_ = 0;
  t._3_1_ = 0;
  ret = tcg_temp_new_i64(tcg_ctx_00);
  tcg_gen_add_i64(tcg_ctx_00,ret,tcg_ctx_00->regs[reg],tcg_ctx_00->regs[(int)uVar1]);
  c._0_8_ = tcg_temp_new_i32(tcg_ctx_00);
  c.u.s32.a = tcg_temp_new_i32(tcg_ctx_00);
  tcg_gen_extrl_i64_i32_s390x(tcg_ctx_00,(TCGv_i32)c._0_8_,ret);
  tcg_gen_extrl_i64_i32_s390x(tcg_ctx_00,c.u.s32.a,tcg_ctx_00->regs[(int)(uVar1 | 1)]);
  store_reg32_i64(tcg_ctx_00,reg,ret);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  DVar2 = help_branch(s,(DisasCompare_conflict2 *)&t,(_Bool)(c.u._15_1_ & 1),c.u._8_4_,o->in2);
  return DVar2;
}

Assistant:

static DisasJumpType op_bx32(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    int r3 = get_field(s, r3);
    bool is_imm = have_field(s, i2);
    int imm = is_imm ? get_field(s, i2) : 0;
    DisasCompare c;
    TCGv_i64 t;

    c.cond = (s->insn->data ? TCG_COND_LE : TCG_COND_GT);
    c.is_64 = false;
    c.g1 = false;
    c.g2 = false;

    t = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_add_i64(tcg_ctx, t, tcg_ctx->regs[r1], tcg_ctx->regs[r3]);
    c.u.s32.a = tcg_temp_new_i32(tcg_ctx);
    c.u.s32.b = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32(tcg_ctx, c.u.s32.a, t);
    tcg_gen_extrl_i64_i32(tcg_ctx, c.u.s32.b, tcg_ctx->regs[r3 | 1]);
    store_reg32_i64(tcg_ctx, r1, t);
    tcg_temp_free_i64(tcg_ctx, t);

    return help_branch(s, &c, is_imm, imm, o->in2);
}